

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.c
# Opt level: O2

pnm_t * pnm_create_from_file(char *path)

{
  byte *pbVar1;
  byte *pbVar2;
  FILE *__stream;
  pnm_t *__ptr;
  char *pcVar3;
  uint8_t *__ptr_00;
  size_t sVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  uint32_t uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  int params [3];
  char tmp [1024];
  
  __stream = fopen(path,"rb");
  __ptr_00 = (uint8_t *)0x0;
  if (__stream == (FILE *)0x0) {
    return (pnm_t *)0x0;
  }
  __ptr = (pnm_t *)calloc(1,0x20);
  __ptr->format = -1;
  iVar6 = -1;
  lVar12 = 0;
LAB_003cd879:
  iVar7 = (int)lVar12;
  if (iVar7 < 3) {
    if ((iVar7 == 2) && (iVar6 == 4)) {
      __ptr->width = params[0];
      __ptr->height = params[1];
      __ptr->max = params[2];
      goto LAB_003cd988;
    }
    do {
      pcVar3 = fgets(tmp,0x400,__stream);
      if (pcVar3 == (char *)0x0) goto LAB_003cda56;
    } while (tmp[0] == '#');
    pbVar8 = (byte *)tmp;
    if (tmp[0] == 'P' && iVar6 == -1) {
      iVar6 = tmp[1] + -0x30;
      __ptr->format = iVar6;
      pbVar8 = (byte *)(tmp + 2);
      if (2 < (int)tmp[1] - 0x34U) {
        pcVar3 = 
        "pnm->format == PNM_FORMAT_GRAY || pnm->format == PNM_FORMAT_RGB || pnm->format == PNM_FORMAT_BINARY"
        ;
        uVar11 = 0x3c;
        goto LAB_003cda9c;
      }
    }
    for (lVar12 = (long)iVar7; lVar12 < 3; lVar12 = lVar12 + 1) {
      bVar5 = *pbVar8;
      pbVar2 = pbVar8;
      if (bVar5 == 0) goto LAB_003cd879;
      while (bVar5 == 0x20) {
        pbVar1 = pbVar8 + 1;
        pbVar8 = pbVar8 + 1;
        pbVar2 = pbVar2 + 1;
        bVar5 = *pbVar1;
      }
      if ((byte)(bVar5 - 0x3a) < 0xf6) goto LAB_003cd879;
      iVar7 = 0;
      pbVar8 = pbVar2 + 1;
      while ((byte)(bVar5 - 0x30) < 10) {
        iVar7 = iVar7 * 10 + (uint)bVar5 + -0x30;
        bVar5 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      }
      params[lVar12] = iVar7;
    }
    lVar12 = 3;
    goto LAB_003cd879;
  }
  __ptr->width = params[0];
  __ptr->height = params[1];
  __ptr->max = params[2];
  if (iVar6 == 6) {
    if (params[2] == 0xff) {
      iVar6 = 3;
    }
    else {
      if (params[2] != 0xffff) {
        pcVar3 = "0";
        uVar11 = 0x7e;
LAB_003cda9c:
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pnm.c"
                      ,uVar11,"pnm_t *pnm_create_from_file(const char *)");
      }
      iVar6 = params[0];
      params[0] = 6;
    }
    uVar9 = params[1] * iVar6 * params[0];
    __ptr->buflen = uVar9;
  }
  else {
    if (iVar6 != 5) {
      if (iVar6 == 4) {
LAB_003cd988:
        __ptr->max = 1;
        uVar11 = ((params[0] + 7) / 8) * params[1];
        uVar10 = (ulong)uVar11;
        __ptr->buflen = uVar11;
        __ptr_00 = (uint8_t *)malloc(uVar10);
        __ptr->buf = __ptr_00;
        sVar4 = fread(__ptr_00,1,uVar10,__stream);
        if (sVar4 != uVar10) goto LAB_003cda56;
        goto LAB_003cd9cc;
      }
      __ptr_00 = (uint8_t *)0x0;
      goto LAB_003cda56;
    }
    if (params[2] == 0xffff) {
      uVar9 = params[1] * params[0] * 2;
    }
    else {
      if (params[2] != 0xff) {
        pcVar3 = "0";
        uVar11 = 0x6d;
        goto LAB_003cda9c;
      }
      uVar9 = params[1] * params[0];
    }
    __ptr->buflen = uVar9;
  }
  uVar10 = (ulong)uVar9;
  __ptr_00 = (uint8_t *)malloc(uVar10);
  __ptr->buf = __ptr_00;
  sVar4 = fread(__ptr_00,1,uVar10,__stream);
  if (sVar4 == uVar10) {
LAB_003cd9cc:
    fclose(__stream);
    return __ptr;
  }
LAB_003cda56:
  fclose(__stream);
  free(__ptr_00);
  free(__ptr);
  return (pnm_t *)0x0;
}

Assistant:

pnm_t *pnm_create_from_file(const char *path)
{
    FILE *f = fopen(path, "rb");
    if (f == NULL)
        return NULL;

    pnm_t *pnm = calloc(1, sizeof(pnm_t));
    pnm->format = -1;

    char tmp[1024];
    int nparams = 0; // will be 3 when we're all done.
    int params[3];

    while (nparams < 3 && !(pnm->format == PNM_FORMAT_BINARY && nparams == 2)) {
        if (fgets(tmp, sizeof(tmp), f) == NULL)
            goto error;

        // skip comments
        if (tmp[0]=='#')
            continue;

        char *p = tmp;

        if (pnm->format == -1 && tmp[0]=='P') {
            pnm->format = tmp[1]-'0';
            assert(pnm->format == PNM_FORMAT_GRAY || pnm->format == PNM_FORMAT_RGB || pnm->format == PNM_FORMAT_BINARY);
            p = &tmp[2];
        }

        // pull integers out of this line until there are no more.
        while (nparams < 3 && *p!=0) {
            while (*p==' ')
                p++;

            // encounter rubbish? (End of line?)
            if (*p < '0' || *p > '9')
                break;

            int acc = 0;
            while (*p >= '0' && *p <= '9') {
                acc = acc*10 + *p - '0';
                p++;
            }

            params[nparams++] = acc;
            p++;
        }
    }

    pnm->width = params[0];
    pnm->height = params[1];
    pnm->max = params[2];

    switch (pnm->format) {
        case PNM_FORMAT_BINARY: {
            // files in the wild sometimes simply don't set max
            pnm->max = 1;

            pnm->buflen = pnm->height * ((pnm->width + 7)  / 8);
            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;

            fclose(f);
            return pnm;
        }

        case PNM_FORMAT_GRAY: {
            if (pnm->max == 255)
                pnm->buflen = pnm->width * pnm->height;
            else if (pnm->max == 65535)
                pnm->buflen = 2 * pnm->width * pnm->height;
            else
                assert(0);

            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;

            fclose(f);
            return pnm;
        }

        case PNM_FORMAT_RGB: {
            if (pnm->max == 255)
                pnm->buflen = pnm->width * pnm->height * 3;
            else if (pnm->max == 65535)
                pnm->buflen = 2 * pnm->width * pnm->height * 3;
            else
                assert(0);

            pnm->buf = malloc(pnm->buflen);
            size_t len = fread(pnm->buf, 1, pnm->buflen, f);
            if (len != pnm->buflen)
                goto error;
            fclose(f);
            return pnm;
        }
    }

error:
    fclose(f);

    if (pnm != NULL) {
        free(pnm->buf);
        free(pnm);
    }

    return NULL;
}